

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::makeFCD
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar *s;
  UBool UVar1;
  uint16_t uVar2;
  int iVar3;
  UChar *local_68;
  UChar *p;
  uint16_t local_56;
  UChar32 prev;
  UChar c2;
  uint16_t fcd16;
  UChar32 c;
  UChar *prevSrc;
  UChar *pUStack_40;
  int32_t prevFCD16;
  UChar *prevBoundary;
  UErrorCode *errorCode_local;
  ReorderingBuffer *buffer_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  prevSrc._4_4_ = 0;
  pUStack_40 = src;
  buffer_local = (ReorderingBuffer *)limit;
  limit_local = src;
  if (limit == (UChar *)0x0) {
    limit_local = copyLowPrefixFromNulTerminated
                            (this,src,(uint)(ushort)this->minLcccCP,buffer,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      return limit_local;
    }
    pUStack_40 = src;
    if (src < limit_local) {
      uVar2 = getFCD16(this,(uint)(ushort)limit_local[-1]);
      prevSrc._4_4_ = (uint)uVar2;
      pUStack_40 = limit_local;
      if (1 < prevSrc._4_4_) {
        pUStack_40 = limit_local + -1;
      }
    }
    buffer_local = (ReorderingBuffer *)u_strchr_63(limit_local,L'\0');
  }
  prev = 0;
  local_56 = 0;
  do {
    s = limit_local;
    _c2 = limit_local;
    while ((ReorderingBuffer *)limit_local != buffer_local) {
      prev = (UChar32)(ushort)*limit_local;
      if ((uint)prev < (uint)(ushort)this->minLcccCP) {
        prevSrc._4_4_ = prev ^ 0xffffffff;
        limit_local = limit_local + 1;
      }
      else {
        UVar1 = singleLeadMightHaveNonZeroFCD16(this,prev);
        if (UVar1 == '\0') {
          prevSrc._4_4_ = 0;
          limit_local = limit_local + 1;
        }
        else {
          if ((((prev & 0xfffffc00U) == 0xd800) &&
              ((ReorderingBuffer *)(limit_local + 1) != buffer_local)) &&
             ((limit_local[1] & 0xfc00U) == 0xdc00)) {
            prev = prev * 0x400 + (uint)(ushort)limit_local[1] + -0x35fdc00;
          }
          local_56 = getFCD16FromNormData(this,prev);
          if (0xff < local_56) break;
          prevSrc._4_4_ = (uint)local_56;
          iVar3 = 2;
          if ((uint)prev < 0x10000) {
            iVar3 = 1;
          }
          limit_local = limit_local + iVar3;
        }
      }
    }
    if (limit_local == s) {
      if ((ReorderingBuffer *)limit_local == buffer_local) {
        return limit_local;
      }
    }
    else {
      if (((buffer != (ReorderingBuffer *)0x0) &&
          (UVar1 = ReorderingBuffer::appendZeroCC(buffer,s,limit_local,errorCode), UVar1 == '\0'))
         || ((ReorderingBuffer *)limit_local == buffer_local)) {
        return limit_local;
      }
      pUStack_40 = limit_local;
      if ((int)prevSrc._4_4_ < 0) {
        if ((int)(prevSrc._4_4_ ^ 0xffffffff) < (int)(uint)(ushort)this->minDecompNoCP) {
          prevSrc._4_4_ = 0;
        }
        else {
          uVar2 = getFCD16FromNormData(this,prevSrc._4_4_ ^ 0xffffffff);
          prevSrc._4_4_ = (uint)uVar2;
          if (1 < prevSrc._4_4_) {
            pUStack_40 = limit_local + -1;
          }
        }
      }
      else {
        local_68 = limit_local + -1;
        if ((((*local_68 & 0xfc00U) == 0xdc00) && (s < local_68)) &&
           ((limit_local[-2] & 0xfc00U) == 0xd800)) {
          local_68 = limit_local + -2;
          uVar2 = getFCD16FromNormData
                            (this,(uint)(ushort)*local_68 * 0x400 + (uint)(ushort)limit_local[-1] +
                                  -0x35fdc00);
          prevSrc._4_4_ = (uint)uVar2;
        }
        if (1 < (int)prevSrc._4_4_) {
          pUStack_40 = local_68;
        }
      }
      _c2 = limit_local;
    }
    iVar3 = 2;
    if ((uint)prev < 0x10000) {
      iVar3 = 1;
    }
    limit_local = limit_local + iVar3;
    if ((uint)((int)(uint)local_56 >> 8) < (prevSrc._4_4_ & 0xff)) {
      if (buffer == (ReorderingBuffer *)0x0) {
        return pUStack_40;
      }
      ReorderingBuffer::removeSuffix(buffer,(int32_t)((long)_c2 - (long)pUStack_40 >> 1));
      limit_local = findNextFCDBoundary(this,limit_local,(UChar *)buffer_local);
      decomposeShort(this,pUStack_40,limit_local,'\0','\0',buffer,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        return limit_local;
      }
      prevSrc._4_4_ = 0;
      pUStack_40 = limit_local;
    }
    else {
      if ((local_56 & 0xff) < 2) {
        pUStack_40 = limit_local;
      }
      if ((buffer != (ReorderingBuffer *)0x0) &&
         (UVar1 = ReorderingBuffer::appendZeroCC(buffer,prev,errorCode), UVar1 == '\0')) {
        return limit_local;
      }
      prevSrc._4_4_ = (uint)local_56;
    }
  } while( true );
}

Assistant:

const UChar *
Normalizer2Impl::makeFCD(const UChar *src, const UChar *limit,
                         ReorderingBuffer *buffer,
                         UErrorCode &errorCode) const {
    // Tracks the last FCD-safe boundary, before lccc=0 or after properly-ordered tccc<=1.
    // Similar to the prevBoundary in the compose() implementation.
    const UChar *prevBoundary=src;
    int32_t prevFCD16=0;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minLcccCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        if(prevBoundary<src) {
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            // Fetching the fcd16 value was deferred for this below-U+0300 code point.
            prevFCD16=getFCD16(*(src-1));
            if(prevFCD16>1) {
                --prevBoundary;
            }
        }
        limit=u_strchr(src, 0);
    }

    // Note: In this function we use buffer->appendZeroCC() because we track
    // the lead and trail combining classes here, rather than leaving it to
    // the ReorderingBuffer.
    // The exception is the call to decomposeShort() which uses the buffer
    // in the normal way.

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t fcd16=0;

    for(;;) {
        // count code units with lccc==0
        for(prevSrc=src; src!=limit;) {
            if((c=*src)<minLcccCP) {
                prevFCD16=~c;
                ++src;
            } else if(!singleLeadMightHaveNonZeroFCD16(c)) {
                prevFCD16=0;
                ++src;
            } else {
                if(U16_IS_LEAD(c)) {
                    UChar c2;
                    if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                    }
                }
                if((fcd16=getFCD16FromNormData(c))<=0xff) {
                    prevFCD16=fcd16;
                    src+=U16_LENGTH(c);
                } else {
                    break;
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL && !buffer->appendZeroCC(prevSrc, src, errorCode)) {
                break;
            }
            if(src==limit) {
                break;
            }
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            if(prevFCD16<0) {
                // Fetching the fcd16 value was deferred for this below-minLcccCP code point.
                UChar32 prev=~prevFCD16;
                if(prev<minDecompNoCP) {
                    prevFCD16=0;
                } else {
                    prevFCD16=getFCD16FromNormData(prev);
                    if(prevFCD16>1) {
                        --prevBoundary;
                    }
                }
            } else {
                const UChar *p=src-1;
                if(U16_IS_TRAIL(*p) && prevSrc<p && U16_IS_LEAD(*(p-1))) {
                    --p;
                    // Need to fetch the previous character's FCD value because
                    // prevFCD16 was just for the trail surrogate code point.
                    prevFCD16=getFCD16FromNormData(U16_GET_SUPPLEMENTARY(p[0], p[1]));
                    // Still known to have lccc==0 because its lead surrogate unit had lccc==0.
                }
                if(prevFCD16>1) {
                    prevBoundary=p;
                }
            }
            // The start of the current character (c).
            prevSrc=src;
        } else if(src==limit) {
            break;
        }

        src+=U16_LENGTH(c);
        // The current character (c) at [prevSrc..src[ has a non-zero lead combining class.
        // Check for proper order, and decompose locally if necessary.
        if((prevFCD16&0xff)<=(fcd16>>8)) {
            // proper order: prev tccc <= current lccc
            if((fcd16&0xff)<=1) {
                prevBoundary=src;
            }
            if(buffer!=NULL && !buffer->appendZeroCC(c, errorCode)) {
                break;
            }
            prevFCD16=fcd16;
            continue;
        } else if(buffer==NULL) {
            return prevBoundary;  // quick check "no"
        } else {
            /*
             * Back out the part of the source that we copied or appended
             * already but is now going to be decomposed.
             * prevSrc is set to after what was copied/appended.
             */
            buffer->removeSuffix((int32_t)(prevSrc-prevBoundary));
            /*
             * Find the part of the source that needs to be decomposed,
             * up to the next safe boundary.
             */
            src=findNextFCDBoundary(src, limit);
            /*
             * The source text does not fulfill the conditions for FCD.
             * Decompose and reorder a limited piece of the text.
             */
            decomposeShort(prevBoundary, src, FALSE, FALSE, *buffer, errorCode);
            if (U_FAILURE(errorCode)) {
                break;
            }
            prevBoundary=src;
            prevFCD16=0;
        }
    }
    return src;
}